

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

string * __thiscall
punky::ast::BlockStmt::to_string_abi_cxx11_(string *__return_storage_ptr__,BlockStmt *this)

{
  bool bVar1;
  pointer pSVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  reference local_50;
  unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_> *stmt;
  const_iterator __end2;
  const_iterator __begin2;
  StmtNodeVector *__range2;
  allocator<char> local_1a;
  undefined1 local_19;
  BlockStmt *local_18;
  BlockStmt *this_local;
  string *blk_str;
  
  local_19 = 0;
  local_18 = this;
  this_local = (BlockStmt *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"{ ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  __end2 = std::
           vector<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>
           ::begin(&this->m_blk_statements);
  stmt = (unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_> *)
         std::
         vector<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>
         ::end(&this->m_blk_statements);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_*,_std::vector<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>_>
                                     *)&stmt), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_*,_std::vector<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>_>
               ::operator*(&__end2);
    pSVar2 = std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>::
             operator->(local_50);
    (*(pSVar2->super_AstNode)._vptr_AstNode[3])(&local_90);
    std::operator+(&local_70,&local_90,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_*,_std::vector<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string BlockStmt::to_string() const
{
    std::string blk_str{"{ "};
    for (const auto& stmt : m_blk_statements)
        blk_str.append(stmt->to_string() + "\n");
    blk_str.pop_back();
    blk_str.append(" }");
    return blk_str;
}